

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall djb::sgd::ndf(sgd *this,vec3 *wh)

{
  double __y;
  double dVar1;
  long lVar2;
  long in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  value_type vVar8;
  
  (**(code **)(*(long *)wh + 0x10))();
  pfVar3 = extraout_RDX;
  if (0 < *(int *)&(this->super_brdf_rgb).super_brdf._vptr_brdf) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)&wh[1].y;
      dVar6 = *(double *)(lVar2 + 0x40 + lVar4 * 8);
      __y = *(double *)(lVar2 + 0x58 + lVar4 * 8);
      dVar1 = *(double *)(lVar2 + 0xa0 + lVar4 * 8);
      dVar7 = (double)*(float *)(in_RDX + 8) * (double)*(float *)(in_RDX + 8);
      dVar6 = ((1.0 - dVar7) / dVar7) / dVar6 + dVar6;
      dVar5 = exp(-dVar6);
      dVar6 = pow(dVar6,__y);
      *(float *)((long)&((this->m_fresnel).m_f)->_vptr_impl + lVar4 * 4) =
           (float)((dVar5 * dVar1 * 0.31830987732601135) / (dVar6 * dVar7 * dVar7));
      lVar4 = lVar4 + 1;
      pfVar3 = extraout_RDX_00;
    } while (lVar4 < *(int *)&(this->super_brdf_rgb).super_brdf._vptr_brdf);
  }
  vVar8._M_data = pfVar3;
  vVar8._M_size = (size_t)this;
  return vVar8;
}

Assistant:

brdf::value_type sgd::ndf(const vec3 &wh) const
{
	brdf::value_type ndf = zero_value();

	for (int i = 0; i < (int)ndf.size(); ++i)
		ndf[i] = (float_t)sgd__ndf((double)wh.z, m_data->alpha[i],
								   m_data->p[i], m_data->kap[i]);

	return ndf;
}